

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O0

Writer * __thiscall chatra::Writer::outMethod(Writer *this,Method *method)

{
  bool bVar1;
  const_reference pvVar2;
  Method *method_local;
  Writer *this_local;
  
  if (method == (Method *)0x0) {
    out<int,_nullptr>(this,0);
  }
  else if ((method->super_MethodBase).node == (Node *)0x0) {
    bVar1 = std::vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>::empty
                      (&(method->super_ArgumentMatcher).args);
    if (bVar1) {
      out<int,_nullptr>(this,2);
      out<const_chatra::Class_*,_nullptr>(this,method->cl);
    }
    else {
      out<int,_nullptr>(this,3);
      out<const_chatra::Class_*,_nullptr>(this,method->cl);
      pvVar2 = std::vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>::operator[]
                         (&(method->super_ArgumentMatcher).args,0);
      out<const_chatra::Class_*,_nullptr>(this,pvVar2->cl);
    }
  }
  else {
    out<int,_nullptr>(this,1);
    out<chatra::Node_*,_nullptr>(this,(method->super_MethodBase).node);
  }
  return this;
}

Assistant:

Writer& Writer::outMethod(const Method* method) {
	chatra_assert(entityMapEnabled);
	CHATRA_SAVE_TYPE_TAG(Method);

	if (method == nullptr)
		out(0);
	else if (method->node == nullptr) {
		chatra_assert(method->cl != nullptr);

		// default constructor or copy/converting constructor
		if (method->args.empty()) {
			out(2);
			out(method->cl);
		}
		else {
			chatra_assert(method->args.size() == 1);
			out(3);
			out(method->cl);
			out(method->args[0].cl);
		}
	}
	else {
		out(1);
		out(method->node);
	}
	return *this;
}